

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger(Parser *this,int *output,char *error)

{
  TokenType TVar1;
  bool bVar2;
  uint64 value;
  allocator<char> local_41;
  uint64 local_40;
  string local_38;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    local_40 = 0;
    bVar2 = io::Tokenizer::ParseInteger(&(this->input_->current_).text,0x7fffffff,&local_40);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Integer out of range.",&local_41);
      AddError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    *output = (int)local_40;
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,error,(allocator<char> *)&local_40);
    AddError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return TVar1 == TYPE_INTEGER;
}

Assistant:

bool Parser::ConsumeInteger(int* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text,
                                     kint32max, &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
    }
    *output = value;
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}